

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::CBasicVertexDef::Run<glcts::(anonymous_namespace)::test_api::GL>
          (CBasicVertexDef *this)

{
  CallLogWrapper *this_00;
  GLsizei width;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  GLuint GVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  runtime_error *this_01;
  long lVar4;
  long lVar5;
  CColorArray coords;
  CElementArray elements;
  CColorArray bufferRef;
  CColorArray bufferTest;
  DrawArraysIndirectCommand indirectArrays;
  DrawElementsIndirectCommand indirectElements;
  DIResult result;
  allocator_type local_3c9;
  CColorArray local_3c8;
  string local_3b0;
  string local_390;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_370;
  undefined4 local_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined4 local_338;
  undefined1 local_328 [8];
  _func_int **pp_Stack_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [23];
  long local_1a8;
  DILogger local_1a0;
  
  local_3c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::PrimitiveGen
            (&this->super_DrawIndirectBase,this->_primitiveType,this->_drawSizeX,this->_drawSizeY,
             &local_3c8);
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,0x1b32ab9);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar1 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)local_328,&local_3b0,&local_390,true);
  this->_program = GVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if (local_328 != (undefined1  [8])local_318) {
    operator_delete((void *)local_328,local_318[0]._M_allocated_capacity + 1);
  }
  if (this->_program == 0) {
    lVar4 = -1;
  }
  else {
    this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_vbo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_vbo);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               (long)local_3c8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3c8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               local_3c8.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e4);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    local_358 = 0;
    uStack_354 = 0;
    uStack_350 = 0;
    uStack_34c = 0;
    local_338 = 0;
    local_348 = 0;
    uStack_344 = 0;
    uStack_340 = 0;
    uStack_33c = 0;
    local_328 = (undefined1  [8])((ulong)(uint)local_328._4_4_ << 0x20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3b0,
               (long)local_3c8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3c8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,
               (value_type_conflict4 *)local_328,(allocator_type *)&local_390);
    if (local_3b0._M_string_length - (long)local_3b0._M_dataplus._M_p != 0) {
      lVar4 = (long)(local_3b0._M_string_length - (long)local_3b0._M_dataplus._M_p) >> 2;
      lVar5 = 0;
      do {
        *(int *)(local_3b0._M_dataplus._M_p + lVar5 * 4) = (int)lVar5;
        lVar5 = lVar5 + 1;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    }
    if (this->_drawFunc == DRAW_ARRAYS) {
      local_358 = (undefined4)
                  ((ulong)((long)local_3c8.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_3c8.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
      uStack_354 = 1;
      uStack_350 = 0;
      uStack_34c = 0;
      glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)local_328);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,local_328._0_4_);
      glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x10,&local_358,0x88e4);
      glu::CallLogWrapper::glDrawArraysIndirect(this_00,this->_primitiveType,(void *)0x0);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)local_328);
    }
    else {
      if (this->_drawFunc != DRAW_ELEMENTS) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Unknown draw function!");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_348 = (undefined4)
                  ((ulong)((long)local_3c8.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_3c8.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
      uStack_344 = 1;
      uStack_340 = 0;
      uStack_33c = 0;
      local_338 = 0;
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
      glu::CallLogWrapper::glBufferData
                (this_00,0x8893,local_3b0._M_string_length - (long)local_3b0._M_dataplus._M_p,
                 local_3b0._M_dataplus._M_p,0x88e4);
      glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)local_328);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,local_328._0_4_);
      glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x14,&local_348,0x88e4);
      glu::CallLogWrapper::glDrawElementsIndirect(this_00,this->_primitiveType,0x1405,(void *)0x0);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)local_328);
    }
    iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar2 = *(int *)CONCAT44(extraout_var,iVar2);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_328 = (undefined1  [8])0x3e4ccccd3dcccccd;
    pp_Stack_320 = (_func_int **)0x3f8000003e99999a;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_390,
               (long)(iVar2 * *(int *)(CONCAT44(extraout_var_00,iVar3) + 4)),(value_type *)local_328
               ,(allocator_type *)&local_370);
    iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar2 = *(int *)CONCAT44(extraout_var_01,iVar2);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_328 = (undefined1  [8])0x0;
    pp_Stack_320 = (_func_int **)0x0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_370,(long)(iVar2 * *(int *)(CONCAT44(extraout_var_02,iVar3) + 4)),
               (value_type *)local_328,&local_3c9);
    iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    width = *(GLsizei *)CONCAT44(extraout_var_03,iVar2);
    iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_04,iVar2) + 4),0x1908,0x1406,
               local_370.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    local_328 = (undefined1  [8])((ulong)local_328 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_320);
    local_1a8 = 0;
    iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthTest = *(uint *)CONCAT44(extraout_var_05,iVar2);
    iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    heightTest = *(uint *)(CONCAT44(extraout_var_06,iVar2) + 4);
    iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthRef = *(uint *)CONCAT44(extraout_var_07,iVar2);
    iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar4 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,&local_370,widthTest,heightTest,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &local_390,widthRef,*(uint *)(CONCAT44(extraout_var_08,iVar2) + 4));
    DIResult::sub_result(&local_1a0,(DIResult *)local_328,lVar4);
    DILogger::~DILogger(&local_1a0);
    lVar4 = local_1a8;
    DILogger::~DILogger((DILogger *)local_328);
    if (local_370.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_370.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_370.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_370.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_390._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_390._M_dataplus._M_p,
                      local_390.field_2._M_allocated_capacity - (long)local_390._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_3b0._M_dataplus._M_p,
                      local_3b0.field_2._M_allocated_capacity - (long)local_3b0._M_dataplus._M_p);
    }
  }
  if (local_3c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return lVar4;
}

Assistant:

long Run()
	{
		CColorArray coords;
		PrimitiveGen(_primitiveType, _drawSizeX, _drawSizeY, coords);

		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		glGenBuffers(1, &_vbo);
		glBindBuffer(GL_ARRAY_BUFFER, _vbo);
		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STATIC_DRAW);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawArraysIndirectCommand   indirectArrays   = { 0, 0, 0, 0 };
		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			indirectArrays.count			  = static_cast<GLuint>(coords.size());
			indirectArrays.primCount		  = 1;
			indirectArrays.first			  = 0;
			indirectArrays.reservedMustBeZero = 0;

			{
				GLuint buffer;
				glGenBuffers(1, &buffer);
				glBindBuffer(GL_DRAW_INDIRECT_BUFFER, buffer);
				glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(indirectArrays), &indirectArrays, GL_STATIC_DRAW);
				glDrawArraysIndirect(_primitiveType, 0);
				glDeleteBuffers(1, &buffer);
			}
		}
		break;
		case DRAW_ELEMENTS:
		{
			indirectElements.count				= static_cast<GLuint>(coords.size());
			indirectElements.primCount			= 1;
			indirectElements.firstIndex			= 0;
			indirectElements.baseVertex			= 0;
			indirectElements.reservedMustBeZero = 0;

			glGenBuffers(1, &_ebo);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
						 GL_STATIC_DRAW);

			{
				GLuint buffer;
				glGenBuffers(1, &buffer);
				glBindBuffer(GL_DRAW_INDIRECT_BUFFER, buffer);
				glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(indirectElements), &indirectElements, GL_STATIC_DRAW);
				glDrawElementsIndirect(_primitiveType, GL_UNSIGNED_INT, 0);
				glDeleteBuffers(1, &buffer);
			}
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		CColorArray bufferRef(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));
		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight(), &bufferTest[0]);

		DIResult result;
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight(), bufferRef, getWindowWidth(),
										 getWindowHeight()));

		return result.code();
	}